

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gridtestExternalTests.cpp
# Opt level: O1

TestResults __thiscall
ExternalTester::getError
          (ExternalTester *this,BaseFunction *f,TasmanianSparseGrid *grid,TestType type,
          vector<double,_std::allocator<double>_> *x)

{
  uint num_dimensions;
  uint uVar1;
  pointer pdVar2;
  undefined4 *puVar3;
  pointer pdVar4;
  ulong uVar5;
  uint *puVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  int iVar13;
  uint uVar14;
  long lVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  double dVar18;
  double dVar19;
  double dVar20;
  TestResults TVar21;
  vector<double,_std::allocator<double>_> y;
  vector<double,_std::allocator<double>_> r;
  vector<double,_std::allocator<double>_> points;
  vector<double,_std::allocator<double>_> local_d8;
  BaseFunction *local_b8;
  pointer local_b0;
  allocator_type local_a1;
  TasmanianSparseGrid *local_a0;
  vector<double,_std::allocator<double>_> local_98;
  vector<double,_std::allocator<double>_> local_80;
  undefined8 local_68;
  undefined8 uStack_60;
  ulong local_58;
  ulong local_50;
  vector<double,_std::allocator<double>_> *local_48;
  long local_40;
  value_type_conflict1 local_38;
  
  uVar9 = (ulong)type;
  num_dimensions = (**f->_vptr_BaseFunction)(f);
  local_b8 = f;
  uVar1 = (*f->_vptr_BaseFunction[1])(f);
  lVar7 = *(long *)(grid + 8);
  if (lVar7 == 0) {
    uVar16 = 0;
  }
  else {
    puVar3 = (undefined4 *)(lVar7 + 0x20);
    if (*(long *)(lVar7 + 0x28) == *(long *)(lVar7 + 0x30)) {
      puVar3 = (undefined4 *)(lVar7 + 0x48);
    }
    uVar16 = *puVar3;
  }
  local_a0 = grid;
  local_58 = uVar9;
  if (type < type_internal_interpolation) {
    local_50 = CONCAT44(local_50._4_4_,uVar16);
    uVar14 = 1;
    if (type == type_nodal_differentiation) {
      uVar14 = num_dimensions;
    }
    TasGrid::TasmanianSparseGrid::getPoints(&local_80,grid);
    local_48 = x;
    if (type == type_integration) {
      TasGrid::TasmanianSparseGrid::getQuadratureWeights(&local_d8,grid);
    }
    else if (type == type_nodal_interpolation) {
      TasGrid::TasmanianSparseGrid::getInterpolationWeights((vector *)&local_d8);
    }
    else {
      TasGrid::TasmanianSparseGrid::getDifferentiationWeights((vector *)&local_d8);
    }
    pdVar2 = local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_b0 = local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    iVar13 = uVar14 * uVar1;
    local_68 = (double)CONCAT44(local_68._4_4_,iVar13);
    std::vector<double,_std::allocator<double>_>::vector
              (&local_d8,(long)iVar13,(allocator_type *)&local_98);
    local_38 = 0.0;
    std::vector<double,_std::allocator<double>_>::vector(&local_98,(long)iVar13,&local_38,&local_a1)
    ;
    uVar9 = local_50 & 0xffffffff;
    if (type == type_nodal_differentiation) {
      if (0 < (int)local_50) {
        local_40 = (long)(int)num_dimensions;
        uVar14 = 0;
        uVar12 = 0;
        local_50 = uVar9;
        do {
          (*local_b8->_vptr_BaseFunction[3])
                    (local_b8,local_80.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start + uVar12 * local_40,
                     local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start);
          if (0 < (int)uVar1) {
            uVar9 = 0;
            pdVar4 = local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            do {
              if (0 < (int)num_dimensions) {
                uVar10 = 0;
                do {
                  pdVar4[uVar10] =
                       pdVar2[uVar14 + uVar10] *
                       local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar9] + pdVar4[uVar10];
                  uVar10 = uVar10 + 1;
                } while (num_dimensions != uVar10);
              }
              uVar9 = uVar9 + 1;
              pdVar4 = pdVar4 + num_dimensions;
            } while (uVar9 != uVar1);
          }
          uVar12 = uVar12 + 1;
          uVar14 = uVar14 + num_dimensions;
        } while (uVar12 != local_50);
      }
    }
    else if (0 < (int)local_50) {
      uVar10 = (ulong)local_68 & 0xffffffff;
      uVar12 = 0;
      do {
        (*local_b8->_vptr_BaseFunction[3])
                  (local_b8,local_80.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start + uVar12 * (long)(int)num_dimensions,
                   local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start);
        if (0 < (int)(uint)local_68) {
          uVar5 = 0;
          do {
            local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[uVar5] =
                 pdVar2[uVar12] *
                 local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar5] +
                 local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar5];
            uVar5 = uVar5 + 1;
          } while (uVar10 != uVar5);
        }
        uVar12 = uVar12 + 1;
      } while (uVar12 != uVar9);
    }
    if ((int)local_58 == 0) {
      (*local_b8->_vptr_BaseFunction[4])();
    }
    else {
      (*local_b8->_vptr_BaseFunction[(ulong)((int)local_58 == 2) * 2 + 3])
                (local_b8,(local_48->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                          super__Vector_impl_data._M_start,
                 local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start);
    }
    grid = local_a0;
    if ((int)(uint)local_68 < 1) {
      local_68 = 0.0;
    }
    else {
      uVar9 = (ulong)(uint)local_68;
      local_68 = 0.0;
      uVar12 = 0;
      do {
        local_68 = local_68 +
                   ABS(local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar12] -
                       local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar12]);
        uVar12 = uVar12 + 1;
      } while (uVar9 != uVar12);
    }
    uStack_60 = 0;
    if (local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (pdVar2 != (pointer)0x0) {
      uVar9 = (long)local_b0 - (long)pdVar2;
      local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = pdVar2;
LAB_00118c68:
      operator_delete(local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,uVar9);
    }
  }
  else {
    if (1 < type - type_internal_interpolation) goto LAB_00118c84;
    loadValues(local_b8,grid);
    genRandom(&local_80,this->num_mc,num_dimensions);
    uVar14 = 1;
    if (type != type_internal_interpolation) {
      uVar14 = num_dimensions;
    }
    uVar1 = uVar1 * uVar14;
    lVar7 = (long)(int)uVar1;
    std::vector<double,_std::allocator<double>_>::vector
              (&local_d8,this->num_mc * lVar7,(allocator_type *)&local_98);
    std::vector<double,_std::allocator<double>_>::vector
              (&local_98,this->num_mc * lVar7,(allocator_type *)&local_38);
    if (type == type_internal_interpolation) {
      if (0 < this->num_mc) {
        lVar15 = 0;
        lVar11 = 0;
        lVar8 = 0;
        do {
          TasGrid::TasmanianSparseGrid::evaluate
                    ((double *)local_a0,
                     (double *)
                     ((long)local_80.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start + lVar15));
          (*local_b8->_vptr_BaseFunction[3])
                    (local_b8,(long)local_80.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_start + lVar15,
                     (long)local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start + lVar11);
          lVar8 = lVar8 + 1;
          lVar11 = lVar11 + lVar7 * 8;
          lVar15 = lVar15 + (long)(int)num_dimensions * 8;
        } while (lVar8 < this->num_mc);
      }
    }
    else if (0 < this->num_mc) {
      lVar15 = 0;
      lVar11 = 0;
      lVar8 = 0;
      do {
        TasGrid::TasmanianSparseGrid::differentiate
                  ((double *)local_a0,
                   (double *)
                   ((long)local_80.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start + lVar15));
        (*local_b8->_vptr_BaseFunction[5])
                  (local_b8,(long)local_80.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start + lVar15,
                   (long)local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start + lVar11);
        lVar8 = lVar8 + 1;
        lVar11 = lVar11 + lVar7 * 8;
        lVar15 = lVar15 + (long)(int)num_dimensions * 8;
      } while (lVar8 < this->num_mc);
    }
    grid = local_a0;
    if ((int)uVar1 < 1) {
      local_68 = 0.0;
    }
    else {
      local_68 = 0.0;
      uVar9 = 0;
      pdVar2 = local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar4 = local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        dVar20 = 0.0;
        dVar18 = 0.0;
        if (0 < this->num_mc) {
          lVar7 = 0;
          dVar20 = 0.0;
          uVar12 = (ulong)(uint)this->num_mc;
          dVar19 = 0.0;
          do {
            dVar18 = ABS(*(double *)((long)pdVar2 + lVar7));
            if (dVar18 <= dVar20) {
              dVar18 = dVar20;
            }
            dVar20 = dVar18;
            dVar18 = ABS(*(double *)((long)pdVar2 + lVar7) - *(double *)((long)pdVar4 + lVar7));
            if (dVar18 <= dVar19) {
              dVar18 = dVar19;
            }
            lVar7 = lVar7 + (ulong)uVar1 * 8;
            uVar12 = uVar12 - 1;
            dVar19 = dVar18;
          } while (uVar12 != 0);
        }
        dVar18 = (double)(~-(ulong)(ABS(dVar20) <= 1e-12) & (ulong)(dVar18 / dVar20) |
                         (ulong)dVar18 & -(ulong)(ABS(dVar20) <= 1e-12));
        if (dVar18 <= local_68) {
          dVar18 = local_68;
        }
        local_68 = dVar18;
        uVar9 = uVar9 + 1;
        pdVar4 = pdVar4 + 1;
        pdVar2 = pdVar2 + 1;
      } while (uVar9 != uVar1);
    }
    uStack_60 = 0;
    if ((int)local_58 == 4) {
      dVar18 = unitDerivativeTests(local_b8,local_a0);
      uVar16 = SUB84(dVar18,0);
      uVar17 = (undefined4)((ulong)dVar18 >> 0x20);
      if (dVar18 <= local_68) {
        uVar16 = SUB84(local_68,0);
        uVar17 = (undefined4)((ulong)local_68 >> 0x20);
      }
      local_68 = (double)CONCAT44(uVar17,uVar16);
      uStack_60 = CONCAT44(extraout_XMM0_Dd,extraout_XMM0_Dc);
    }
    if (local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      uVar9 = (long)local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage -
              (long)local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
      goto LAB_00118c68;
    }
  }
  if (local_80.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_80.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_80.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
LAB_00118c84:
  lVar7 = *(long *)(grid + 8);
  if (lVar7 == 0) {
    uVar9 = 0;
  }
  else {
    puVar6 = (uint *)(lVar7 + 0x20);
    if (*(long *)(lVar7 + 0x28) == *(long *)(lVar7 + 0x30)) {
      puVar6 = (uint *)(lVar7 + 0x48);
    }
    uVar9 = (ulong)*puVar6;
  }
  TVar21._8_8_ = uVar9;
  TVar21.error = local_68;
  return TVar21;
}

Assistant:

TestResults ExternalTester::getError(const BaseFunction *f, TasGrid::TasmanianSparseGrid &grid, TestType type, std::vector<double> const &x) const{
    TestResults R;
    int num_dimensions = f->getNumInputs();
    int num_outputs = f->getNumOutputs();
    int num_points = grid.getNumPoints();
    if (type == type_integration or type == type_nodal_interpolation or type == type_nodal_differentiation){
        int num_entries = (type == type_nodal_differentiation) ? num_dimensions * num_outputs : num_outputs;
        auto points = grid.getPoints();
        std::vector<double> weights;
        if (type == type_integration)
            weights = grid.getQuadratureWeights();
        else if (type == type_nodal_interpolation)
            weights = grid.getInterpolationWeights(x);
        else
            weights = grid.getDifferentiationWeights(x);

        // Sequential version
        std::vector<double> y(num_entries);
        std::vector<double> r(num_entries, 0.0);
        if (type == type_nodal_differentiation){
            for(int i=0; i<num_points; i++){
                f->eval(&(points[i*num_dimensions]), y.data());
                for (int k=0; k<num_outputs; k++)
                    for(int j=0; j<num_dimensions; j++)
                        r[k * num_dimensions + j] += weights[i * num_dimensions + j] * y[k];
            }
        }else{
            for(int i=0; i<num_points; i++){
                f->eval(&(points[i*num_dimensions]), y.data());
                for(int k=0; k<num_entries; k++)
                    r[k] += weights[i] * y[k];
            }
        }

        double err = 0.0;
        if (type == type_integration){
            f->getIntegral(y.data());
        }else if (type == type_nodal_differentiation){
            f->getDerivative(x.data(), y.data());
        }else{
            f->eval(x.data(), y.data());
        }
        for(int j=0; j<num_entries; j++){
            err += std::abs(y[j] - r[j]);
        };
        R.error = err;
    }else if (type == type_internal_interpolation or type == type_internal_differentiation){
        // load needed points
        loadValues(f, grid);

        std::vector<double> test_x = genRandom(num_mc, num_dimensions);
        int num_entries = (type == type_internal_interpolation) ? num_outputs : num_outputs * num_dimensions;
        std::vector<double> result_tasm(num_mc * num_entries);
        std::vector<double> result_true(num_mc * num_entries);
        if (type == type_internal_interpolation) {
            #pragma omp parallel for // note that iterators do not work with OpenMP, direct indexing does
            for(int i=0; i<num_mc; i++){
                grid.evaluate(&(test_x[i * num_dimensions]), &(result_tasm[i * num_entries]));
                f->eval(&(test_x[i * num_dimensions]), &(result_true[i * num_entries]));
            }
        } else {
            #pragma omp parallel for // note that iterators do not work with OpenMP, direct indexing does
            for(int i=0; i<num_mc; i++){
                grid.differentiate(&(test_x[i * num_dimensions]), &(result_tasm[i * num_entries]));
                f->getDerivative(&(test_x[i * num_dimensions]), &(result_true[i * num_entries]));
            }
        }

        double rel_err = 0.0; // relative error
        for(int k=0; k<num_entries; k++){
            double nrm = 0.0; // norm, needed to compute relative error
            double err = 0.0; // absolute error
            for(int i=0; i<num_mc; i++){
                nrm = std::max(nrm, std::fabs(result_true[i * num_entries + k]));
                err = std::max(err, std::fabs(result_true[i * num_entries + k] - result_tasm[i * num_entries + k]));
            }
            rel_err = std::max(rel_err, std::fabs(nrm) <= Maths::num_tol ? err : err / nrm);
        }

        if (type == type_internal_differentiation)
            rel_err = std::max(rel_err, unitDerivativeTests(f, grid));

        R.error = rel_err;
    }
    R.num_points = grid.getNumPoints();
    return R;
}